

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_logic_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int16_t imm)

{
  TCGContext_conflict6 *tcg_ctx;
  ulong arg2;
  uint uVar1;
  TCGv_i64 ret;
  
  if ((rt == 0) || (uVar1 = opc << 6 | opc + 0xd0000000 >> 0x1a, 3 < uVar1)) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  arg2 = (ulong)(ushort)imm;
  switch(uVar1) {
  case 0:
    ret = tcg_ctx->cpu_gpr[rt];
    if (rs != 0) {
      tcg_gen_andi_i64_mips64el(tcg_ctx,ret,tcg_ctx->cpu_gpr[rs],arg2);
      return;
    }
    arg2 = 0;
    break;
  case 1:
    ret = tcg_ctx->cpu_gpr[rt];
    if (rs != 0) {
      tcg_gen_ori_i64_mips64el(tcg_ctx,ret,tcg_ctx->cpu_gpr[rs],arg2);
      return;
    }
    break;
  case 2:
    ret = tcg_ctx->cpu_gpr[rt];
    if (rs != 0) {
      tcg_gen_xori_i64_mips64el(tcg_ctx,ret,tcg_ctx->cpu_gpr[rs],arg2);
      return;
    }
    break;
  case 3:
    if ((rs != 0) && ((ctx->insn_flags & 0x2000) != 0)) {
      tcg_gen_addi_i64_mips64el
                (tcg_ctx,tcg_ctx->cpu_gpr[rt],tcg_ctx->cpu_gpr[rs],
                 (long)(int)((uint)(ushort)imm << 0x10));
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rt],tcg_ctx->cpu_gpr[rt]);
      return;
    }
    ret = tcg_ctx->cpu_gpr[rt];
    arg2 = (ulong)(int)((uint)(ushort)imm << 0x10);
  }
  tcg_gen_movi_i64_mips64el(tcg_ctx,ret,arg2);
  return;
}

Assistant:

static void gen_logic_imm(DisasContext *ctx, uint32_t opc,
                          int rt, int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm;

    if (rt == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }
    uimm = (uint16_t)imm;
    switch (opc) {
    case OPC_ANDI:
        if (likely(rs != 0)) {
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rs], uimm);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], 0);
        }
        break;
    case OPC_ORI:
        if (rs != 0) {
            tcg_gen_ori_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rs], uimm);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], uimm);
        }
        break;
    case OPC_XORI:
        if (likely(rs != 0)) {
            tcg_gen_xori_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rs], uimm);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], uimm);
        }
        break;
    case OPC_LUI:
        if (rs != 0 && (ctx->insn_flags & ISA_MIPS32R6)) {
            /* OPC_AUI */
            tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rs], imm << 16);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], imm << 16);
        }
        break;

    default:
        break;
    }
}